

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O2

Real __thiscall NavierStokesBase::volWgtSum(NavierStokesBase *this,string *name,Real time)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  NavierStokesBase *pNVar5;
  Long LVar6;
  int iVar7;
  pointer ppVar8;
  int j_1;
  FabArray<amrex::FArrayBox> *pFVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  double *__s;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int j;
  ulong uVar18;
  double dVar19;
  double local_220;
  FabArray<amrex::FArrayBox> *local_218;
  NavierStokesBase *local_210;
  FabArray<amrex::FArrayBox> *local_208;
  FabArray<amrex::FArrayBox> *local_200;
  long local_1f8;
  long local_1f0;
  double local_1e8;
  int local_1dc;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  Box local_1b4;
  BoxArray *local_198;
  ulong local_190;
  long local_188;
  double *local_180;
  pointer local_178;
  pointer local_170;
  long local_168;
  long local_160;
  ulong local_158;
  long local_150;
  double *local_148;
  ulong local_140;
  Array4<double> local_138;
  MFIter mfi;
  BoxArray baf;
  
  (*(this->super_AmrLevel)._vptr_AmrLevel[0x1f])(&local_218,this,name,0);
  local_210 = this;
  if ((this->super_AmrLevel).level <
      *(int *)&(((this->super_AmrLevel).parent)->super_AmrCore).super_AmrMesh.super_AmrInfo.
               field_0x8c) {
    amrex::BoxArray::BoxArray(&baf);
    pNVar5 = local_210;
    amrex::BoxArray::operator=
              (&baf,(((local_210->super_AmrLevel).parent)->super_AmrCore).super_AmrMesh.grids.
                    super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                    super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                    super__Vector_impl_data._M_start + (long)(local_210->super_AmrLevel).level + 1);
    amrex::BoxArray::coarsen(&baf,&(pNVar5->super_AmrLevel).fine_ratio);
    isects.
    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    isects.
    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    isects.
    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    amrex::MFIter::MFIter(&mfi,&local_218->super_FabArrayBase,true);
    local_198 = &(local_210->super_AmrLevel).grids;
    while (mfi.currentIndex < mfi.endIndex) {
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_138,local_218,&mfi);
      uVar1 = (local_218->super_FabArrayBase).n_comp;
      amrex::BoxArray::operator[]
                (&local_1b4,local_198,
                 ((mfi.index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[mfi.currentIndex]);
      amrex::BoxArray::intersections(&baf,&local_1b4,&isects);
      LVar6 = local_138.jstride;
      local_178 = isects.
                  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      local_150 = local_138.kstride;
      local_168 = local_138.nstride;
      local_188 = (long)local_138.begin.y;
      if ((int)uVar1 < 1) {
        uVar1 = 0;
      }
      local_158 = (ulong)uVar1;
      lVar16 = local_138.jstride * 8;
      local_180 = local_138.p + -(long)local_138.begin.x;
      local_190 = (ulong)(uint)-local_138.begin.z;
      ppVar8 = isects.
               super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      while (ppVar8 != local_178) {
        iVar2 = (ppVar8->second).smallend.vect[0];
        local_220 = (double)(long)iVar2;
        local_140 = (ulong)(ppVar8->second).smallend.vect[1];
        local_1dc = (ppVar8->second).smallend.vect[2];
        local_160 = (long)local_1dc;
        iVar3 = (ppVar8->second).bigend.vect[0];
        iVar4 = (ppVar8->second).bigend.vect[1];
        local_200 = (FabArray<amrex::FArrayBox> *)(long)(ppVar8->second).bigend.vect[2];
        local_1e8 = (double)((ulong)(uint)(iVar3 - iVar2) * 8 + 8);
        local_148 = (double *)((local_140 - local_188) * lVar16 + (long)local_180);
        local_1dc = (int)local_190 + local_1dc;
        pFVar9 = (FabArray<amrex::FArrayBox> *)0x0;
        local_170 = ppVar8;
        while (lVar11 = local_160, iVar7 = local_1dc,
              pFVar9 != (FabArray<amrex::FArrayBox> *)local_158) {
          while (local_208 = pFVar9, lVar11 <= (long)local_200) {
            local_1f0 = CONCAT44(local_1f0._4_4_,iVar7);
            __s = local_148 + iVar7 * local_150 + (long)local_220;
            local_1f8 = lVar11;
            for (uVar18 = local_140 & 0xffffffff; (int)uVar18 <= iVar4;
                uVar18 = (ulong)((int)uVar18 + 1)) {
              if (iVar2 <= iVar3) {
                memset(__s,0,(size_t)local_1e8);
              }
              __s = __s + LVar6;
            }
            iVar7 = (int)local_1f0 + 1;
            pFVar9 = local_208;
            lVar11 = local_1f8 + 1;
          }
          local_220 = (double)((long)local_220 + local_168);
          pFVar9 = (FabArray<amrex::FArrayBox> *)((long)local_208 + 1);
        }
        ppVar8 = local_170 + 1;
      }
      amrex::MFIter::operator++(&mfi);
    }
    amrex::MFIter::~MFIter(&mfi);
    std::_Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
    ~_Vector_base(&isects.
                   super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                 );
    amrex::BoxArray::~BoxArray(&baf);
  }
  local_1e8 = (local_210->super_AmrLevel).geom.super_CoordSys.dx[0] *
              (local_210->super_AmrLevel).geom.super_CoordSys.dx[1] *
              (local_210->super_AmrLevel).geom.super_CoordSys.dx[2];
  if ((0.0 < volWgtSum_sub_dz) && (0.0 < volWgtSum_sub_Rcyl)) {
    amrex::Abort_host("EB volWgtSum currently only works over entire cartesian domain.");
  }
  local_200 = &local_210->volfrac->super_FabArray<amrex::FArrayBox>;
  isects.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  isects.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)isects.
                        super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
  local_208 = local_218;
  amrex::MFIter::MFIter((MFIter *)&baf,&local_218->super_FabArrayBase,true);
  local_220 = 0.0;
  while (baf.m_bat.m_op.m_bndryReg.m_loshft.vect[2] < baf.m_bat.m_op.m_bndryReg.m_hishft.vect[1]) {
    amrex::MFIter::growntilebox(&local_1b4,(MFIter *)&baf,(IntVect *)&isects);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              ((Array4<const_double> *)&mfi,local_208,(MFIter *)&baf);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              ((Array4<const_double> *)&local_138,local_200,(MFIter *)&baf);
    lVar16 = (long)local_1b4.smallend.vect[0];
    local_1f0 = (long)local_1b4.smallend.vect[1];
    lVar11 = (long)local_1b4.smallend.vect[2];
    local_1f8 = local_138.kstride * 8;
    lVar17 = (local_1f0 - local_138.begin.y) * local_138.jstride * 8 +
             (lVar11 - local_138.begin.z) * local_1f8 + lVar16 * 8 + (long)local_138.begin.x * -8 +
             (long)local_138.p;
    lVar12 = (local_1f0 - mfi.beginIndex) * (long)mfi.fabArray * 8 +
             (lVar11 - mfi.endIndex) * mfi.tile_size.vect._0_8_ * 8 + lVar16 * 8 +
             (long)mfi.currentIndex * -8 +
             (long)mfi.m_fa._M_t.
                   super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                   .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
    dVar19 = 0.0;
    for (; lVar10 = local_1f0, lVar13 = lVar12, lVar14 = lVar17, lVar11 <= local_1b4.bigend.vect[2];
        lVar11 = lVar11 + 1) {
      for (; lVar10 <= local_1b4.bigend.vect[1]; lVar10 = lVar10 + 1) {
        for (lVar15 = 0; lVar16 + lVar15 <= (long)local_1b4.bigend.vect[0]; lVar15 = lVar15 + 1) {
          dVar19 = dVar19 + *(double *)(lVar13 + lVar15 * 8) * *(double *)(lVar14 + lVar15 * 8) *
                            local_1e8;
        }
        lVar13 = lVar13 + (long)mfi.fabArray * 8;
        lVar14 = lVar14 + local_138.jstride * 8;
      }
      lVar17 = lVar17 + local_1f8;
      lVar12 = lVar12 + mfi.tile_size.vect._0_8_ * 8;
    }
    local_220 = local_220 + dVar19;
    amrex::MFIter::operator++((MFIter *)&baf);
  }
  amrex::MFIter::~MFIter((MFIter *)&baf);
  if (local_218 != (FabArray<amrex::FArrayBox> *)0x0) {
    (*(local_218->super_FabArrayBase)._vptr_FabArrayBase[1])();
  }
  return local_220;
}

Assistant:

Real
NavierStokesBase::volWgtSum (const std::string& name,
                             Real               time)
{
    Real  volwgtsum = 0.0;
    const Real* dx  = geom.CellSize();
    auto        mf  = derive(name,time,0);

    // First, zero covered regions
    if (level < parent->finestLevel())
    {
        BoxArray    baf;
        baf = parent->boxArray(level+1);
        baf.coarsen(fine_ratio);
#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
{
	std::vector< std::pair<int,Box> > isects;
        for (MFIter mfi(*mf,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
           auto const& fabarr = mf->array(mfi);
           int          ncomp = mf->nComp();
           baf.intersections(grids[mfi.index()],isects);

	   for (const auto& is : isects)
	   {
	      amrex::ParallelFor(is.second, ncomp, [fabarr]
              AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
              {
                 fabarr(i,j,k,n) = 0.0;
              });
           }
        }
}
    }

    // Use amrex::ReduceSum
    // TODO set the cases for RZ, but it needs the radius to be somewhere in managed memory and so on
    Real vol = D_TERM(dx[0],*dx[1],*dx[2]);
#ifdef AMREX_USE_EB
    if ( (volWgtSum_sub_dz > 0 && volWgtSum_sub_Rcyl > 0) ) {
        amrex::Abort("EB volWgtSum currently only works over entire cartesian domain.");
    }
    Real sm = amrex::ReduceSum(*mf, *volfrac, 0, [vol]
    AMREX_GPU_HOST_DEVICE (Box const& bx, Array4<Real const> const& mf_arr, Array4<Real const> const& vf_arr) -> Real
    {
        Real sum = 0.0;
        AMREX_LOOP_3D(bx, i, j, k,
        {
            sum += mf_arr(i,j,k) * vf_arr(i,j,k) * vol;
        });
        return sum;
    });
#else
    const Real* dom_lo = geom.ProbLo();
    const Real sub_dz = volWgtSum_sub_dz;
    const Real sub_Rcyl = volWgtSum_sub_Rcyl;
    Real sm = amrex::ReduceSum(*mf, 0, [vol, sub_dz, sub_Rcyl, dx, dom_lo]
    AMREX_GPU_HOST_DEVICE (Box const& bx, Array4<Real const> const& mf_arr) -> Real
    {
        Real sum = 0.0;
        if ( sub_dz > 0 && sub_Rcyl > 0 ) {
           // TODO : test this in 2D
           const auto lo = amrex::lbound(bx);
           const auto hi = amrex::ubound(bx);
           for       (int k = lo.z; k <= hi.z; ++k) {
              Real z = dom_lo[2] + (k+0.5_rt) * dx[2];
              if ( z <= sub_dz ) {
                 for    (int j = lo.y; j <= hi.y; ++j) {
                    Real y = dom_lo[1] + (j+0.5_rt) * dx[1];
                    for (int i = lo.x; i <= hi.x; ++i) {
                       Real x = dom_lo[0] + (i+0.5_rt) * dx[0];
                       Real r = std::sqrt(x*x + y*y);
                       if ( r <= sub_Rcyl ) {
                          sum += mf_arr(i,j,k) * vol;
                       }
                    }
                 }
              }
           }
        } else {
           AMREX_LOOP_3D(bx, i, j, k,
           {
               sum += mf_arr(i,j,k) * vol;
           });
        }
        return sum;
    });
#endif

    volwgtsum = sm;

    ParallelDescriptor::ReduceRealSum(volwgtsum);

    return volwgtsum;
}